

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_x86.c
# Opt level: O2

int main(void)

{
  cs_mode mode;
  x86_reg xVar1;
  uint8_t *buffer;
  cs_detail *pcVar2;
  csh ud;
  cs_insn *pcVar3;
  size_t count;
  cs_err cVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  char *__format;
  uint post;
  cs_insn *insn;
  size_t local_48;
  long local_40;
  size_t local_38;
  
  lVar9 = 0;
  do {
    if (lVar9 == 4) {
      return 0;
    }
    mode = (&DAT_00266514)[lVar9 * 10];
    local_40 = lVar9;
    cVar4 = cs_open(CS_ARCH_X86,mode,&handle);
    if (cVar4 == CS_ERR_OK) {
      if ((&DAT_00266530)[lVar9 * 10] != 0) {
        cs_option(handle,(&DAT_00266530)[lVar9 * 10],(ulong)(uint)(&DAT_00266534)[lVar9 * 10]);
      }
      cs_option(handle,CS_OPT_DETAIL,3);
      buffer = (&PTR_anon_var_dwarf_27_00266518)[lVar9 * 5];
      sVar11 = (&DAT_00266520)[lVar9 * 5];
      local_48 = cs_disasm(handle,buffer,sVar11,0x1000,0,&insn);
      if (local_48 == 0) {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266528)[lVar9 * 5]);
        print_string_hex("Code:",buffer,sVar11);
        puts("ERROR: Failed to disasm given code!");
      }
      else {
        puts("****************");
        printf("Platform: %s\n",(&PTR_anon_var_dwarf_45_00266528)[lVar9 * 5]);
        print_string_hex("Code:",buffer,sVar11);
        puts("Disasm:");
        for (sVar11 = 0; count = local_48, sVar11 != local_48; sVar11 = sVar11 + 1) {
          printf("0x%lx:\t%s\t%s\n",insn[sVar11].address,insn[sVar11].mnemonic,insn[sVar11].op_str);
          pcVar3 = insn;
          ud = handle;
          pcVar2 = insn[sVar11].detail;
          if (pcVar2 != (cs_detail *)0x0) {
            local_38 = sVar11;
            print_string_hex("\tPrefix:",(uchar *)&pcVar2->field_6,4);
            print_string_hex("\tOpcode:",(pcVar2->field_6).x86.opcode,4);
            printf("\trex: 0x%x\n",(ulong)(pcVar2->field_6).x86.rex);
            printf("\taddr_size: %u\n",(ulong)(pcVar2->field_6).x86.addr_size);
            printf("\tmodrm: 0x%x\n",(ulong)(pcVar2->field_6).x86.modrm);
            printf("\tdisp: 0x%x\n",(ulong)(pcVar2->field_6).arm.cps_mode);
            if ((mode & CS_MODE_16) == CS_MODE_ARM) {
              printf("\tsib: 0x%x\n",(ulong)(pcVar2->field_6).x86.sib);
              xVar1 = (pcVar2->field_6).x86.sib_base;
              if (xVar1 != X86_REG_INVALID) {
                pcVar7 = cs_reg_name(handle,xVar1);
                printf("\t\tsib_base: %s\n",pcVar7);
              }
              xVar1 = (pcVar2->field_6).x86.sib_index;
              if (xVar1 != X86_REG_INVALID) {
                pcVar7 = cs_reg_name(handle,xVar1);
                printf("\t\tsib_index: %s\n",pcVar7);
              }
              if ((pcVar2->field_6).x86.sib_scale != '\0') {
                printf("\t\tsib_scale: %d\n");
              }
            }
            if ((pcVar2->field_6).x86.sse_cc != X86_SSE_CC_INVALID) {
              printf("\tsse_cc: %u\n");
            }
            if ((pcVar2->field_6).x86.avx_cc != X86_AVX_CC_INVALID) {
              printf("\tavx_cc: %u\n");
            }
            if ((pcVar2->field_6).x86.avx_sae == true) {
              printf("\tavx_sae: %u\n",1);
            }
            if ((pcVar2->field_6).x86.avx_rm != X86_AVX_RM_INVALID) {
              printf("\tavx_rm: %u\n");
            }
            uVar5 = cs_op_count(ud,pcVar3 + sVar11,2);
            if (uVar5 != 0) {
              printf("\timm_count: %u\n",(ulong)uVar5);
              if ((int)uVar5 < 1) {
                uVar5 = 0;
              }
              for (post = 1; post - uVar5 != 1; post = post + 1) {
                iVar6 = cs_op_index(ud,pcVar3 + sVar11,2,post);
                printf("\t\timms[%u]: 0x%lx\n",(ulong)post,
                       *(undefined8 *)(pcVar2->groups + (long)iVar6 * 0x30 + 0x46));
              }
            }
            if ((pcVar2->field_6).x86.op_count != '\0') {
              printf("\top_count: %u\n");
            }
            pcVar7 = (char *)((long)&pcVar2->field_6 + 0x58);
            for (uVar10 = 0; uVar10 < (pcVar2->field_6).x86.op_count; uVar10 = uVar10 + 1) {
              switch(*(undefined4 *)(pcVar7 + -0x28)) {
              case 1:
                pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x20));
                __format = "\t\toperands[%u].type: REG = %s\n";
                goto LAB_001426b9;
              case 2:
                pcVar8 = *(char **)(pcVar7 + -0x20);
                __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
LAB_001426b9:
                printf(__format,uVar10 & 0xffffffff,pcVar8);
                break;
              case 3:
                printf("\t\toperands[%u].type: MEM\n",uVar10 & 0xffffffff);
                if (*(uint *)(pcVar7 + -0x20) != 0) {
                  pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x20));
                  printf("\t\t\toperands[%u].mem.segment: REG = %s\n",uVar10 & 0xffffffff,pcVar8);
                }
                if (*(uint *)(pcVar7 + -0x1c) != 0) {
                  pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x1c));
                  printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar10 & 0xffffffff,pcVar8);
                }
                if (*(uint *)(pcVar7 + -0x18) != 0) {
                  pcVar8 = cs_reg_name(handle,*(uint *)(pcVar7 + -0x18));
                  printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar10 & 0xffffffff,pcVar8);
                }
                if (*(int *)(pcVar7 + -0x14) != 1) {
                  printf("\t\t\toperands[%u].mem.scale: %u\n",uVar10 & 0xffffffff);
                }
                pcVar8 = *(char **)(pcVar7 + -0x10);
                if (pcVar8 != (char *)0x0) {
                  __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                  goto LAB_001426b9;
                }
                break;
              case 4:
                printf("\t\toperands[%u].type: FP = %f\n",*(undefined8 *)(pcVar7 + -0x20),
                       uVar10 & 0xffffffff);
              }
              if (*(int *)(pcVar7 + -4) != 0) {
                printf("\t\toperands[%u].avx_bcast: %u\n",uVar10 & 0xffffffff);
              }
              if (*pcVar7 == '\x01') {
                printf("\t\toperands[%u].avx_zero_opmask: TRUE\n",uVar10 & 0xffffffff);
              }
              printf("\t\toperands[%u].size: %u\n",uVar10 & 0xffffffff,(ulong)(byte)pcVar7[-8]);
              pcVar7 = pcVar7 + 0x30;
            }
            putchar(10);
            sVar11 = local_38;
          }
        }
        printf("0x%lx:\n",(ulong)insn[local_48 - 1].size + insn[local_48 - 1].address);
        cs_free(insn,count);
      }
      putchar(10);
      cs_close(&handle);
    }
    else {
      printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar4);
    }
    lVar9 = local_40 + 1;
  } while( true );
}

Assistant:

int main()
{
	test();

	return 0;
}